

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
network::Network::sendSurvey
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Network *this,string *data,regex *reg)

{
  _func_int ***ppp_Var1;
  execution_context eVar2;
  service_registry *psVar3;
  undefined8 uVar4;
  error_category *peVar5;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:67:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op;
  undefined8 uVar6;
  service *psVar7;
  long in_FS_OFFSET;
  io_service service;
  function<void_(const_boost::system::error_code_&,_unsigned_long)> onRead;
  deadline_timer timer;
  socket receivingSock;
  char buf [1024];
  io_context local_580;
  service_registry *local_570;
  io_context *local_568;
  undefined8 uStack_560;
  code *local_558;
  code *pcStack_550;
  error_code local_548;
  undefined1 local_538 [8];
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:67:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *local_530;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:67:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *pwStack_528;
  error_category *local_520;
  _Alloc_hider local_518;
  size_type local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  undefined1 local_4f8 [16];
  undefined1 local_4e8;
  undefined3 uStack_4e7;
  undefined8 uStack_4e4;
  per_timer_data local_4e0;
  executor_type local_4b8;
  impl_type local_488 [4];
  
  boost::asio::io_context::io_context(&local_580);
  memset((void *)((long)&local_488[0].mutex_.mutex_.mutex_ + 0x18),0,0x400);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_570 = (service_registry *)__return_storage_ptr__;
  sendBroadcast(this,data);
  local_4f8._8_4_ = 0;
  local_4f8._12_4_ = 0;
  _local_4e8 = 0;
  uStack_4e4 = 0;
  local_4f8._2_2_ = this->port_ << 8 | this->port_ >> 8;
  local_4f8._0_2_ = 2;
  local_4f8._4_4_ = 0;
  boost::asio::
  basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket<boost::asio::io_context>
            ((basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_488,&local_580,(endpoint_type *)local_4f8,(type *)0x0);
  local_538 = (undefined1  [8])0x30d40;
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_deadline_timer<boost::asio::io_context>
            ((basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_4f8,&local_580,(duration_type *)local_538,(type *)0x0);
  uVar4 = local_4f8._0_8_;
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_568 = &local_580;
  local_538 = (undefined1  [8])&local_568;
  op = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:67:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)boost::asio::detail::thread_info_base::
          allocate<boost::asio::detail::thread_info_base::default_tag>(uVar6,0x60);
  pwStack_528 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:67:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *)0x0;
  (op->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
  (op->super_wait_op).super_operation.func_ =
       boost::asio::detail::
       wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:67:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->super_wait_op).super_operation.task_result_ = 0;
  (op->super_wait_op).ec_.val_ = 0;
  (op->super_wait_op).ec_.failed_ = false;
  (op->super_wait_op).ec_.cat_ =
       (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  (op->handler_).service = local_568;
  local_530 = op;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base(&(op->work_).
                       super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                      ,&local_4b8);
  local_4e8 = 1;
  pwStack_528 = op;
  boost::asio::detail::epoll_reactor::
  schedule_timer<boost::asio::time_traits<boost::posix_time::ptime>>
            (*(epoll_reactor **)(uVar4 + 0x68),
             (timer_queue<boost::asio::time_traits<boost::posix_time::ptime>_> *)(uVar4 + 0x28),
             (time_type *)(local_4f8 + 8),(per_timer_data *)((long)register0x00000020 + -0x4e0),
             (wait_op *)op);
  local_530 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:67:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               *)0x0;
  pwStack_528 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:67:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *)0x0;
  boost::asio::detail::
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:67:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::reset((ptr *)local_538);
  psVar3 = local_570;
  local_558 = (code *)0x0;
  pcStack_550 = (code *)0x0;
  local_568 = (io_context *)0x0;
  uStack_560 = 0;
  local_568 = (io_context *)operator_new(0x28);
  local_538 = (undefined1  [8])((long)&local_488[0].mutex_.mutex_.mutex_ + 0x18);
  (local_568->super_execution_context).service_registry_ = (service_registry *)local_538;
  local_568->impl_ = (impl_type *)reg;
  local_568[1].super_execution_context.service_registry_ = psVar3;
  local_548._0_8_ = local_488;
  local_568[1].impl_ = (impl_type *)local_548._0_8_;
  local_568[2].super_execution_context.service_registry_ = (service_registry *)&local_568;
  pcStack_550 = std::
                _Function_handler<void_(const_boost::system::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:70:3)>
                ::_M_invoke;
  local_558 = std::
              _Function_handler<void_(const_boost::system::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:70:3)>
              ::_M_manager;
  local_530 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:67:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               *)0x400;
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::initiate_async_receive::operator()
            ((initiate_async_receive *)&local_548,
             (function<void_(const_boost::system::error_code_&,_unsigned_long)> *)&local_568,
             (mutable_buffers_1 *)local_538,0);
  local_548._0_8_ = local_548._0_8_ & 0xffffff0000000000;
  local_548.cat_ =
       (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  boost::asio::detail::scheduler::run(local_580.impl_,&local_548);
  peVar5 = local_548.cat_;
  uVar4 = local_548._0_8_;
  if (local_548.failed_ == true) {
    std::runtime_error::runtime_error((runtime_error *)local_538,"");
    local_518._M_p = (pointer)&local_508;
    local_538 = (undefined1  [8])&PTR__system_error_00170ba0;
    pwStack_528 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_2_sha[P]P2P_chat_src_network_network_cpp:67:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   *)uVar4;
    local_520 = peVar5;
    local_510 = 0;
    local_508._M_local_buf[0] = '\0';
    boost::throw_exception<boost::system::system_error>((system_error *)local_538);
  }
  if (local_558 != (code *)0x0) {
    (*local_558)(&local_568,&local_568,3);
  }
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)local_4f8);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)local_488);
  for (psVar7 = (local_580.super_execution_context.service_registry_)->first_service_;
      eVar2.service_registry_ = local_580.super_execution_context.service_registry_,
      psVar7 != (service *)0x0; psVar7 = psVar7->next_) {
    (*psVar7->_vptr_service[2])(psVar7);
  }
  psVar7 = (local_580.super_execution_context.service_registry_)->first_service_;
  while (psVar7 != (service *)0x0) {
    ppp_Var1 = &psVar7->_vptr_service;
    psVar7 = psVar7->next_;
    (*(*ppp_Var1)[1])();
    (eVar2.service_registry_)->first_service_ = psVar7;
  }
  if (local_580.super_execution_context.service_registry_ != (service_registry *)0x0) {
    pthread_mutex_destroy
              ((pthread_mutex_t *)&(local_580.super_execution_context.service_registry_)->mutex_);
    operator_delete(local_580.super_execution_context.service_registry_,0x40);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)psVar3;
}

Assistant:

std::vector<std::string> Network::sendSurvey(const std::string &data, const std::regex &reg)
{
	boost::asio::io_service service;
	char buf[PACKAGE_SIZE];
	memset(buf, 0, PACKAGE_SIZE);
	std::vector<std::string> responses;

	sendBroadcast(data);
	// Accept incoming connections that match the regular expression for 100ms
	udp::socket receivingSock(service, udp::endpoint(udp::v4(), port_));
	boost::asio::deadline_timer timer(service, boost::posix_time::milliseconds(200));
	timer.async_wait(
		[&service](const boost::system::error_code &ex) { service.stop(); }
	);
	std::function<void(const boost::system::error_code&, std::size_t)> onRead =
		[&](const boost::system::error_code &err, std::size_t read_bytes)
	{
		if (std::regex_match(buf, reg))
			responses.push_back(buf);

		memset(buf, 0, PACKAGE_SIZE);
		receivingSock.async_receive(boost::asio::buffer(buf, PACKAGE_SIZE), onRead);
	};
	receivingSock.async_receive(boost::asio::buffer(buf, PACKAGE_SIZE), onRead);

	service.run();
	return responses;
}